

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledOutputFile::~TiledOutputFile(TiledOutputFile *this)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  GenericOutputFile *in_RDI;
  OStream *in_stack_00000018;
  TileOffsets *in_stack_00000020;
  Int64 originalPosition;
  Lock lock;
  Lock *in_stack_ffffffffffffffb0;
  Mutex *in_stack_ffffffffffffffb8;
  Lock *in_stack_ffffffffffffffc0;
  Data *in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__TiledOutputFile_00441828;
  if (in_RDI[1]._vptr_GenericOutputFile != (_func_int **)0x0) {
    IlmThread_2_5::Lock::Lock
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    uVar2 = (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 0x18))();
    if (in_RDI[1]._vptr_GenericOutputFile[0x25] != (_func_int *)0x0) {
      (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 0x20))
                (in_RDI[2]._vptr_GenericOutputFile[5],in_RDI[1]._vptr_GenericOutputFile[0x25]);
      TileOffsets::writeTo(in_stack_00000020,in_stack_00000018);
      (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 0x20))
                (in_RDI[2]._vptr_GenericOutputFile[5],uVar2);
    }
    IlmThread_2_5::Lock::~Lock(in_stack_ffffffffffffffb0);
    if (((((ulong)in_RDI[3]._vptr_GenericOutputFile & 1) != 0) &&
        (in_RDI[2]._vptr_GenericOutputFile != (_func_int **)0x0)) &&
       (in_RDI[2]._vptr_GenericOutputFile[5] != (_func_int *)0x0)) {
      (**(code **)(*(long *)in_RDI[2]._vptr_GenericOutputFile[5] + 8))();
    }
    if ((*(int *)(in_RDI[1]._vptr_GenericOutputFile + 0x2e) == -1) &&
       (in_RDI[2]._vptr_GenericOutputFile != (_func_int **)0x0)) {
      operator_delete(in_RDI[2]._vptr_GenericOutputFile,0x38);
    }
    pp_Var1 = in_RDI[1]._vptr_GenericOutputFile;
    if (pp_Var1 != (_func_int **)0x0) {
      Data::~Data(in_stack_fffffffffffffff0);
      operator_delete(pp_Var1,0x178);
    }
  }
  GenericOutputFile::~GenericOutputFile(in_RDI);
  return;
}

Assistant:

TiledOutputFile::~TiledOutputFile ()
{
    if (_data)
    {
        {
            Lock lock(*_streamData);
            Int64 originalPosition = _streamData->os->tellp();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _streamData->os->seekp (originalPosition);
                }
                catch (...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }
        
        if (_deleteStream && _streamData)
            delete _streamData->os;

        if (_data->partNumber == -1)
            delete _streamData;

        delete _data;
    }
}